

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> __thiscall
enact::Parser::parseStmt(Parser *this)

{
  Parser *in_RSI;
  
  switch((in_RSI->m_current).type) {
  case BREAK:
    advance(in_RSI);
    parseBreakStmt(this);
    break;
  default:
    parseExpressionStmt(this);
    break;
  case CONTINUE:
    advance(in_RSI);
    parseContinueStmt(this);
    break;
  case ENUM:
    advance(in_RSI);
    parseEnumStmt(this);
    break;
  case FUNC:
    advance(in_RSI);
    parseFunctionStmt(this,SUB81(in_RSI,0));
    break;
  case IMM:
  case MUT:
    advance(in_RSI);
    parseVariableStmt(this);
    break;
  case IMPL:
    advance(in_RSI);
    parseImplStmt(this);
    break;
  case RETURN:
    advance(in_RSI);
    parseReturnStmt(this);
    break;
  case STRUCT:
    advance(in_RSI);
    parseStructStmt(this);
    break;
  case TRAIT:
    advance(in_RSI);
    parseTraitStmt(this);
  }
  return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::parseStmt() {
        try {
            if (consume(TokenType::FUNC))     return parseFunctionStmt();
            if (consume(TokenType::STRUCT))   return parseStructStmt();
            if (consume(TokenType::ENUM))     return parseEnumStmt();
            if (consume(TokenType::TRAIT))    return parseTraitStmt();
            if (consume(TokenType::IMPL))     return parseImplStmt();
            if (consume(TokenType::IMM) ||
                consume(TokenType::MUT))      return parseVariableStmt();
            if (consume(TokenType::RETURN))   return parseReturnStmt();
            if (consume(TokenType::BREAK))    return parseBreakStmt();
            if (consume(TokenType::CONTINUE)) return parseContinueStmt();
            return parseExpressionStmt();
        } catch (ParseError &error) {
            synchronise();
            return nullptr;
        }
    }